

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp0_fast_iVar5(uint *pInOut,int nWords,int *pDifStart)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  
  if (0 < nWords) {
    puVar1 = pInOut + (ulong)(nWords * 2 - 2) + 1;
    iVar3 = nWords * 2;
    do {
      iVar2 = -(uint)(*puVar1 < puVar1[-3]);
      if (puVar1[-3] < *puVar1) {
        iVar2 = 1;
      }
      if (iVar2 != 0) {
        if (iVar2 == -1) goto LAB_00561a39;
        iVar2 = 3;
        goto LAB_00561a42;
      }
      iVar2 = iVar3 + -1;
      puVar1 = puVar1 + -4;
      iVar3 = iVar3 + -4;
    } while (3 < iVar2);
  }
  iVar3 = 0;
LAB_00561a39:
  iVar2 = 0;
LAB_00561a42:
  *pDifStart = iVar3;
  return iVar2;
}

Assistant:

int minTemp0_fast_iVar5(unsigned* pInOut, int nWords, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp0_fast_iVar5\n");
    for(i=(nWords)*2 - 1; i>=0; i-=4)   
    {
        temp = CompareWords(pInOut[i],pInOut[i-3]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+1;
            return 0;
        }
        else
        {
            *pDifStart = i+1;
            return 3;
        }
    }
    *pDifStart=0;
    return 0;
}